

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O1

uint64_t __thiscall doublechecked::Roaring64Map::minimum(Roaring64Map *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  
  uVar1 = roaring::Roaring64Map::minimum(&this->plain);
  if ((this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    uVar2 = *(uint64_t *)((this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
  }
  _assert_true((ulong)(uVar1 == uVar2),
               "check.empty() ? ans == (std::numeric_limits<uint64_t>::max)() : ans == *check.begin()"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64map_checked.hh"
               ,0xd9);
  return uVar1;
}

Assistant:

uint64_t minimum() const {
        uint64_t ans = plain.minimum();
        assert_true(check.empty()
                        ? ans == (std::numeric_limits<uint64_t>::max)()
                        : ans == *check.begin());
        return ans;
    }